

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFExporter.cpp
# Opt level: O0

void __thiscall Assimp::D3MF::D3MFExporter::writeMesh(D3MFExporter *this,aiMesh *mesh)

{
  ostream *poVar1;
  uint local_1c;
  uint matIdx;
  uint i;
  aiMesh *mesh_local;
  D3MFExporter *this_local;
  
  if (mesh != (aiMesh *)0x0) {
    poVar1 = std::operator<<((ostream *)&this->mModelOutput,"<");
    poVar1 = std::operator<<(poVar1,(string *)XmlTag::mesh_abi_cxx11_);
    poVar1 = std::operator<<(poVar1,">");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&this->mModelOutput,"<");
    poVar1 = std::operator<<(poVar1,(string *)XmlTag::vertices_abi_cxx11_);
    poVar1 = std::operator<<(poVar1,">");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    for (local_1c = 0; local_1c < mesh->mNumVertices; local_1c = local_1c + 1) {
      writeVertex(this,mesh->mVertices + local_1c);
    }
    poVar1 = std::operator<<((ostream *)&this->mModelOutput,"</");
    poVar1 = std::operator<<(poVar1,(string *)XmlTag::vertices_abi_cxx11_);
    poVar1 = std::operator<<(poVar1,">");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    writeFaces(this,mesh,mesh->mMaterialIndex);
    poVar1 = std::operator<<((ostream *)&this->mModelOutput,"</");
    poVar1 = std::operator<<(poVar1,(string *)XmlTag::mesh_abi_cxx11_);
    poVar1 = std::operator<<(poVar1,">");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void D3MFExporter::writeMesh( aiMesh *mesh ) {
    if ( nullptr == mesh ) {
        return;
    }

    mModelOutput << "<" << XmlTag::mesh << ">" << std::endl;
    mModelOutput << "<" << XmlTag::vertices << ">" << std::endl;
    for ( unsigned int i = 0; i < mesh->mNumVertices; ++i ) {
        writeVertex( mesh->mVertices[ i ] );
    }
    mModelOutput << "</" << XmlTag::vertices << ">" << std::endl;

    const unsigned int matIdx( mesh->mMaterialIndex );

    writeFaces( mesh, matIdx );

    mModelOutput << "</" << XmlTag::mesh << ">" << std::endl;
}